

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealLPAndRecordStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  double dVar1;
  Settings *pSVar2;
  Tolerances *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Statistics *pSVar5;
  bool bVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  Verbosity old_verbosity;
  Representation p_rep;
  Type tp;
  bool bVar11;
  double extraout_XMM0_Qa;
  Real RVar12;
  double dVar13;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  undefined4 uVar14;
  undefined4 uVar15;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  uint uStack_190;
  uint uStack_18c;
  int iStack_188;
  bool bStack_184;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined5 uStack_140;
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  int iStack_e8;
  bool bStack_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  int iStack_98;
  bool bStack_94;
  undefined8 local_90;
  undefined8 local_88;
  uint auStack_80 [13];
  undefined3 uStack_4b;
  int iStack_48;
  undefined1 uStack_44;
  undefined8 local_40;
  
  pSVar2 = this->_currentSettings;
  dVar13 = pSVar2->_realParamValues[6];
  iVar9 = -1;
  if ((double)pSVar2->_intParamValues[5] < dVar13) {
    iVar10 = pSVar2->_intParamValues[5] - this->_statistics->iterations;
    iVar9 = -1;
    if (-1 < iVar10) {
      iVar9 = iVar10;
    }
  }
  bVar11 = this->_hasBasis;
  (this->_solver).maxIters = iVar9;
  dVar1 = pSVar2->_realParamValues[7];
  if (dVar1 < dVar13) {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    dVar13 = dVar1 - extraout_XMM0_Qa;
  }
  uVar14 = 0;
  uVar15 = 0;
  if (0.0 <= dVar13) {
    uVar14 = SUB84(dVar13,0);
    uVar15 = (undefined4)((ulong)dVar13 >> 0x20);
  }
  (this->_solver).maxTime = (Real)CONCAT44(uVar15,uVar14);
  RVar12 = Tolerances::epsilon((this->_solver).
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x10;
  local_88._0_4_ = 0;
  local_88._4_4_ = 0;
  auStack_80[0] = 0;
  auStack_80[1] = 0;
  auStack_80[2] = 0;
  auStack_80[3] = 0;
  auStack_80[4] = 0;
  auStack_80[5] = 0;
  auStack_80[6] = 0;
  auStack_80[7] = 0;
  auStack_80[8] = 0;
  auStack_80[9] = 0;
  auStack_80[10] = 0;
  auStack_80[0xb] = 0;
  stack0xffffffffffffffb0 = 0;
  uStack_4b = 0;
  iStack_48 = 0;
  uStack_44 = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_88,RVar12);
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 0x10;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems[6] = 0;
  local_268.data._M_elems[7] = 0;
  local_268.data._M_elems[8] = 0;
  local_268.data._M_elems[9] = 0;
  local_268.data._M_elems[10] = 0;
  local_268.data._M_elems[0xb] = 0;
  local_268.data._M_elems[0xc] = 0;
  local_268.data._M_elems[0xd] = 0;
  local_268.data._M_elems._56_5_ = 0;
  local_268.data._M_elems[0xf]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  local_218.fpclass = cpp_dec_float_finite;
  local_218.prec_elem = 0x10;
  local_218.data._M_elems[0] = 0;
  local_218.data._M_elems[1] = 0;
  local_218.data._M_elems[2] = 0;
  local_218.data._M_elems[3] = 0;
  local_218.data._M_elems[4] = 0;
  local_218.data._M_elems[5] = 0;
  local_218.data._M_elems[6] = 0;
  local_218.data._M_elems[7] = 0;
  local_218.data._M_elems[8] = 0;
  local_218.data._M_elems[9] = 0;
  local_218.data._M_elems[10] = 0;
  local_218.data._M_elems[0xb] = 0;
  local_218.data._M_elems[0xc] = 0;
  local_218.data._M_elems[0xd] = 0;
  local_218.data._M_elems._56_5_ = 0;
  local_218.data._M_elems[0xf]._1_3_ = 0;
  local_218.exp = 0;
  local_218.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_218,10000.0);
  local_268.data._M_elems[0] = (uint)local_88;
  local_268.data._M_elems[1] = local_88._4_4_;
  local_268.data._M_elems[2] = auStack_80[0];
  local_268.data._M_elems[3] = auStack_80[1];
  local_268.data._M_elems[4] = auStack_80[2];
  local_268.data._M_elems[5] = auStack_80[3];
  local_268.data._M_elems[6] = auStack_80[4];
  local_268.data._M_elems[7] = auStack_80[5];
  local_268.data._M_elems[8] = auStack_80[6];
  local_268.data._M_elems[9] = auStack_80[7];
  local_268.data._M_elems[10] = auStack_80[8];
  local_268.data._M_elems[0xb] = auStack_80[9];
  local_268.data._M_elems[0xc] = auStack_80[10];
  local_268.data._M_elems[0xd] = auStack_80[0xb];
  local_268.data._M_elems._56_5_ = stack0xffffffffffffffb0;
  local_268.data._M_elems[0xf]._1_3_ = uStack_4b;
  local_268.exp = iStack_48;
  local_268.neg = (bool)uStack_44;
  local_268.fpclass = (fpclass_type)local_40;
  local_268.prec_elem = local_40._4_4_;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_268,&local_218)
  ;
  pTVar3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var4 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  RVar12 = Tolerances::floatingPointFeastol(pTVar3);
  bVar6 = false;
  if ((!NAN(RVar12)) && (local_268.fpclass != cpp_dec_float_NaN)) {
    local_218.fpclass = cpp_dec_float_finite;
    local_218.prec_elem = 0x10;
    local_218.data._M_elems[0] = 0;
    local_218.data._M_elems[1] = 0;
    local_218.data._M_elems[2] = 0;
    local_218.data._M_elems[3] = 0;
    local_218.data._M_elems[4] = 0;
    local_218.data._M_elems[5] = 0;
    local_218.data._M_elems[6] = 0;
    local_218.data._M_elems[7] = 0;
    local_218.data._M_elems[8] = 0;
    local_218.data._M_elems[9] = 0;
    local_218.data._M_elems[10] = 0;
    local_218.data._M_elems[0xb] = 0;
    local_218.data._M_elems[0xc] = 0;
    local_218.data._M_elems[0xd] = 0;
    local_218.data._M_elems._56_5_ = 0;
    local_218.data._M_elems[0xf]._1_3_ = 0;
    local_218.exp = 0;
    local_218.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_218,RVar12);
    iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_268,&local_218);
    bVar6 = 0 < iVar9;
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (bVar6) {
    pTVar3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    dVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                       (&local_268);
    Tolerances::setFloatingPointFeastol(pTVar3,dVar13);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  pTVar3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var4 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  RVar12 = Tolerances::floatingPointOpttol(pTVar3);
  bVar6 = false;
  if ((!NAN(RVar12)) && (bVar6 = false, local_268.fpclass != cpp_dec_float_NaN)) {
    local_218.fpclass = cpp_dec_float_finite;
    local_218.prec_elem = 0x10;
    local_218.data._M_elems[0] = 0;
    local_218.data._M_elems[1] = 0;
    local_218.data._M_elems[2] = 0;
    local_218.data._M_elems[3] = 0;
    local_218.data._M_elems[4] = 0;
    local_218.data._M_elems[5] = 0;
    local_218.data._M_elems[6] = 0;
    local_218.data._M_elems[7] = 0;
    local_218.data._M_elems[8] = 0;
    local_218.data._M_elems[9] = 0;
    local_218.data._M_elems[10] = 0;
    local_218.data._M_elems[0xb] = 0;
    local_218.data._M_elems[0xc] = 0;
    local_218.data._M_elems[0xd] = 0;
    local_218.data._M_elems._56_5_ = 0;
    local_218.data._M_elems[0xf]._1_3_ = 0;
    local_218.exp = 0;
    local_218.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_218,RVar12);
    iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_268,&local_218);
    bVar6 = 0 < iVar9;
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (bVar6) {
    pTVar3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    dVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                       (&local_268);
    Tolerances::setFloatingPointOpttol(pTVar3,dVar13);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  this_00 = &this->_solver;
  pSVar2 = this->_currentSettings;
  iVar9 = pSVar2->_intParamValues[1];
  if (iVar9 == 2) {
LAB_004a0ec6:
    p_rep = ROW;
    if ((this->_solver).theRep == ROW) goto LAB_004a0edc;
  }
  else {
    if (iVar9 != 1) {
      if (iVar9 != 0) goto LAB_004a0edc;
      if ((double)((this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum + 1) <=
          (double)((this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum + 1) * pSVar2->_realParamValues[0x10]) goto LAB_004a0e83;
LAB_004a0e91:
      if ((iVar9 != 2) &&
         ((iVar9 != 0 ||
          ((double)((this->_solver).
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum + 1) <=
           (double)((this->_solver).
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum + 1) * pSVar2->_realParamValues[0x10])))) goto LAB_004a0edc;
      goto LAB_004a0ec6;
    }
LAB_004a0e83:
    p_rep = COLUMN;
    if ((this->_solver).theRep == COLUMN) goto LAB_004a0e91;
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::initRep(this_00,p_rep);
LAB_004a0edc:
  iVar9 = this->_currentSettings->_intParamValues[2];
  if (((((iVar9 == 0) && ((this->_solver).theRep == COLUMN)) ||
       ((iVar9 == 1 && ((this->_solver).theRep == ROW)))) &&
      (tp = ENTER, (this->_solver).theType != ENTER)) ||
     ((((iVar9 == 1 && ((this->_solver).theRep == COLUMN)) ||
       ((iVar9 == 0 && ((this->_solver).theRep == ROW)))) &&
      (tp = LEAVE, (this->_solver).theType != LEAVE)))) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setType(this_00,tp);
  }
  local_90 = 0x1000000000;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_9b = 0;
  iStack_98 = 0;
  bStack_94 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_d8,this->_currentSettings->_realParamValues[0xf]
            );
  *(undefined8 *)(this->_solver).sparsePricingFactor.m_backend.data._M_elems = local_d8;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 2) = uStack_d0;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 4) = local_c8;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 6) = uStack_c0;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 8) = local_b8;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 10) = uStack_b0;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 0xc) = local_a8;
  *(ulong *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 0xe) =
       CONCAT35(uStack_9b,uStack_a0);
  (this->_solver).sparsePricingFactor.m_backend.exp = iStack_98;
  (this->_solver).sparsePricingFactor.m_backend.neg = bStack_94;
  (this->_solver).sparsePricingFactor.m_backend.fpclass = (undefined4)local_90;
  (this->_solver).sparsePricingFactor.m_backend.prec_elem = local_90._4_4_;
  iVar9 = this->_currentSettings->_intParamValues[0x14];
  if (iVar9 == 0) {
    (this->_solver).hyperPricingLeave = false;
    (this->_solver).hyperPricingEnter = false;
  }
  else if ((iVar9 == 2) ||
          ((iVar9 == 1 &&
           (5000 < (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum +
                   (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum)))) {
    (this->_solver).hyperPricingLeave = true;
    (this->_solver).hyperPricingEnter = true;
    DIdxSet::setMax(&(this->_solver).updateViols,(((this->_solver).thecovectors)->set).thenum);
    DIdxSet::setMax(&(this->_solver).updateViolsCo,(((this->_solver).thevectors)->set).thenum);
  }
  local_e0 = 0x1000000000;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_eb = 0;
  iStack_e8 = 0;
  bStack_e4 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_128,
             this->_currentSettings->_realParamValues[0x13]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .nonzeroFactor.m_backend.data._M_elems = local_128;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 2) = uStack_120;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 4) = local_118;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 6) = uStack_110;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 8) = local_108;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 10) = uStack_100;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 0xc) = local_f8;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .nonzeroFactor.m_backend.data._M_elems + 0xe) = CONCAT35(uStack_eb,uStack_f0);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.exp = iStack_e8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.neg = bStack_e4;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.fpclass = (undefined4)local_e0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.prec_elem = local_e0._4_4_;
  local_130 = 0x1000000000;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_13b = 0;
  iStack_138 = 0;
  bStack_134 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_178,
             this->_currentSettings->_realParamValues[0x14]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .fillFactor.m_backend.data._M_elems = local_178;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 2) = uStack_170;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 4) = local_168;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 6) = uStack_160;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 8) = local_158;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 10) = uStack_150;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 0xc) = local_148;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .fillFactor.m_backend.data._M_elems + 0xe) = CONCAT35(uStack_13b,uStack_140);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.exp = iStack_138;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.neg = bStack_134;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.fpclass = (undefined4)local_130;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.prec_elem = local_130._4_4_;
  local_180 = 0x1000000000;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_18c = 0;
  iStack_188 = 0;
  bStack_184 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_1c8,
             this->_currentSettings->_realParamValues[0x15]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .memFactor.m_backend.data._M_elems = local_1c8;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 2) = uStack_1c0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[4] = (uint)local_1b8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[5] = local_1b8._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[6] = (uint)uStack_1b0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[7] = uStack_1b0._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[8] = (uint)local_1a8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[9] = local_1a8._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[10] = (uint)uStack_1a0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xb] = uStack_1a0._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xc] = (uint)local_198;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xd] = local_198._4_4_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xe] = uStack_190;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xf] = uStack_18c;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.exp = iStack_188;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.neg = bStack_184;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.fpclass = (undefined4)local_180;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.prec_elem = local_180._4_4_;
  (*this->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(this_00,interrupt,true);
  (*this->_statistics->simplexTime->_vptr_Timer[4])();
  if ((0 < (this->_solver).
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .iterCount) && ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED)) {
    SLUFactorRational::init(&this->_rationalLUSolver,(EVP_PKEY_CTX *)interrupt);
  }
  iVar9 = (this->_solver).
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .iterCount;
  pSVar5 = this->_statistics;
  pSVar5->iterations = pSVar5->iterations + iVar9;
  iVar10 = iVar9;
  if (iVar9 != 0) {
    iVar10 = (this->_solver).primalCount;
  }
  pSVar5->iterationsPrimal = pSVar5->iterationsPrimal + iVar10;
  iVar10 = 0;
  if (bVar11 != false) {
    iVar10 = iVar9;
  }
  pSVar5->iterationsFromBasis = pSVar5->iterationsFromBasis + iVar10;
  pSVar5->iterationsPolish = pSVar5->iterationsPolish + (this->_solver).polishCount;
  pSVar5->boundflips = pSVar5->boundflips + (this->_solver).totalboundflips;
  (*((this->_solver).multTimeSparse)->_vptr_Timer[6])();
  this->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + this->_statistics->multTimeSparse;
  (*((this->_solver).multTimeFull)->_vptr_Timer[6])();
  this->_statistics->multTimeFull = extraout_XMM0_Qa_01 + this->_statistics->multTimeFull;
  (*((this->_solver).multTimeColwise)->_vptr_Timer[6])();
  this->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + this->_statistics->multTimeColwise;
  (*((this->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  pSVar5 = this->_statistics;
  pSVar5->multTimeUnsetup = extraout_XMM0_Qa_03 + pSVar5->multTimeUnsetup;
  iVar9 = (this->_solver).multFullCalls;
  iVar10 = (this->_solver).multColwiseCalls;
  iVar7 = (this->_solver).multUnsetupCalls;
  pSVar5->multSparseCalls = pSVar5->multSparseCalls + (this->_solver).multSparseCalls;
  pSVar5->multFullCalls = pSVar5->multFullCalls + iVar9;
  pSVar5->multColwiseCalls = pSVar5->multColwiseCalls + iVar10;
  pSVar5->multUnsetupCalls = pSVar5->multUnsetupCalls + iVar7;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[6])();
  this->_statistics->luFactorizationTimeReal =
       extraout_XMM0_Qa_04 + this->_statistics->luFactorizationTimeReal;
  (*((this->_slufactor).solveTime)->_vptr_Timer[6])();
  pSVar5 = this->_statistics;
  pSVar5->luSolveTimeReal = extraout_XMM0_Qa_05 + pSVar5->luSolveTimeReal;
  pSVar5->luFactorizationsReal =
       pSVar5->luFactorizationsReal +
       (this->_slufactor).
       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .factorCount;
  pSVar5->luSolvesReal = pSVar5->luSolvesReal + (this->_slufactor).solveCount;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[2])();
  (*((this->_slufactor).solveTime)->_vptr_Timer[2])();
  (this->_slufactor).
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .factorCount = 0;
  (this->_slufactor).
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .hugeValues = 0;
  (this->_slufactor).solveCount = 0;
  bVar11 = (this->_solver).theRep == ROW;
  pSVar5 = this->_statistics;
  pSVar5->degenPivotsPrimal =
       pSVar5->degenPivotsPrimal +
       *(int *)((long)(&(this->_solver).primalDegenSum.m_backend.data + -1) + 0x30 +
               (ulong)bVar11 * 4);
  pSVar5->degenPivotsDual =
       pSVar5->degenPivotsDual +
       *(int *)((long)(&(this->_solver).primalDegenSum.m_backend.data + -1) + 0x30 +
               (ulong)!bVar11 * 4);
  local_218.data._M_elems._0_8_ =
       *(undefined8 *)(this->_solver).dualDegenSum.m_backend.data._M_elems;
  local_218.data._M_elems._8_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 2);
  local_218.data._M_elems._16_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 4);
  local_218.data._M_elems._24_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 6);
  local_218.data._M_elems._32_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 8);
  local_218.data._M_elems._40_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 10);
  local_218.data._M_elems._48_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 0xc);
  uVar8 = *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 0xe);
  local_218.data._M_elems._56_5_ = SUB85(uVar8,0);
  local_218.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
  local_218.exp = (this->_solver).dualDegenSum.m_backend.exp;
  local_218.neg = (this->_solver).dualDegenSum.m_backend.neg;
  local_218.fpclass = (this->_solver).dualDegenSum.m_backend.fpclass;
  local_218.prec_elem = (this->_solver).dualDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(pSVar5->sumDualDegen).m_backend,&local_218);
  local_218.data._M_elems._0_8_ =
       *(undefined8 *)(this->_solver).primalDegenSum.m_backend.data._M_elems;
  local_218.data._M_elems._8_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 2);
  local_218.data._M_elems._16_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 4);
  local_218.data._M_elems._24_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 6);
  local_218.data._M_elems._32_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 8);
  local_218.data._M_elems._40_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 10);
  local_218.data._M_elems._48_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 0xc);
  uVar8 = *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 0xe);
  local_218.data._M_elems._56_5_ = SUB85(uVar8,0);
  local_218.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
  local_218.exp = (this->_solver).primalDegenSum.m_backend.exp;
  local_218.neg = (this->_solver).primalDegenSum.m_backend.neg;
  local_218.fpclass = (this->_solver).primalDegenSum.m_backend.fpclass;
  local_218.prec_elem = (this->_solver).primalDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(this->_statistics->sumPrimalDegen).m_backend,&local_218);
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}